

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_scope.c
# Opt level: O0

int scope_metadata_array_cb_iterate_counter
              (set s,set_key key,set_value val,set_cb_iterate_args args)

{
  type_id tVar1;
  value in_RCX;
  type_id id;
  scope_metadata_array_cb_iterator metadata_iterator;
  
  tVar1 = value_type_id(in_RCX);
  if (tVar1 == 0xd) {
    *(long *)((long)in_RCX + 0x18) = *(long *)((long)in_RCX + 0x18) + 1;
  }
  else if (tVar1 == 0xf) {
    *(long *)((long)in_RCX + 0x20) = *(long *)((long)in_RCX + 0x20) + 1;
  }
  else if (tVar1 == 0x10) {
    *(long *)((long)in_RCX + 0x28) = *(long *)((long)in_RCX + 0x28) + 1;
  }
  return 0;
}

Assistant:

int scope_metadata_array_cb_iterate_counter(set s, set_key key, set_value val, set_cb_iterate_args args)
{
	scope_metadata_array_cb_iterator metadata_iterator = (scope_metadata_array_cb_iterator)args;

	(void)s;
	(void)key;

	type_id id = value_type_id(val);

	if (id == TYPE_FUNCTION)
	{
		metadata_iterator->functions_size++;
	}
	else if (id == TYPE_CLASS)
	{
		metadata_iterator->classes_size++;
	}
	else if (id == TYPE_OBJECT)
	{
		metadata_iterator->objects_size++;
	}

	return 0;
}